

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O2

Error __thiscall asmjit::CodeBuilder::onDetach(CodeBuilder *this,CodeHolder *code)

{
  Error EVar1;
  
  (this->_cbPasses).super_ZoneVectorBase._capacity = 0;
  (this->_cbLabels).super_ZoneVectorBase._data = (void *)0x0;
  (this->_cbLabels).super_ZoneVectorBase._length = 0;
  (this->_cbLabels).super_ZoneVectorBase._capacity = 0;
  (this->_cbPasses).super_ZoneVectorBase._data = (void *)0x0;
  (this->_cbPasses).super_ZoneVectorBase._length = 0;
  (this->_cbPasses).super_ZoneVectorBase._capacity = 0;
  (this->_cbLabels).super_ZoneVectorBase._data = (void *)0x0;
  ZoneHeap::reset(&this->_cbHeap,&this->_cbBaseZone);
  Zone::reset(&this->_cbBaseZone,false);
  Zone::reset(&this->_cbDataZone,false);
  Zone::reset(&this->_cbPassZone,false);
  this->_firstNode = (CBNode *)0x0;
  this->_lastNode = (CBNode *)0x0;
  this->_cursor = (CBNode *)0x0;
  this->_position = 0;
  this->_nodeFlags = 0;
  EVar1 = CodeEmitter::onDetach(&this->super_CodeEmitter,code);
  return EVar1;
}

Assistant:

Error CodeBuilder::onDetach(CodeHolder* code) noexcept {
  _cbPasses.reset();
  _cbLabels.reset();
  _cbHeap.reset(&_cbBaseZone);

  _cbBaseZone.reset(false);
  _cbDataZone.reset(false);
  _cbPassZone.reset(false);

  _position = 0;
  _nodeFlags = 0;

  _firstNode = nullptr;
  _lastNode = nullptr;
  _cursor = nullptr;

  return Base::onDetach(code);
}